

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSON_writer.hh
# Opt level: O2

Writer * __thiscall JSON::Writer::writeEnd(Writer *this,char *c)

{
  if (1 < this->indent) {
    this->indent = this->indent - 2;
  }
  if (this->first == false) {
    this->first = true;
    writeNext(this);
  }
  this->first = false;
  (*this->p->_vptr_Pipeline[2])(this->p,c,1);
  return this;
}

Assistant:

Writer&
    writeEnd(char const& c)
    {
        if (indent > 1) {
            indent -= 2;
        }
        if (!first) {
            first = true;
            writeNext();
        }
        first = false;
        write(&c, 1);
        return *this;
    }